

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::erase
          (QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *this,
          _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **b,qsizetype n)

{
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **__src;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **pp_Var1;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **pp_Var2;
  long lVar3;
  
  __src = b + n;
  pp_Var2 = (this->super_QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>).
            ptr;
  lVar3 = (this->super_QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>).
          size;
  pp_Var1 = pp_Var2 + lVar3;
  if (__src == pp_Var1 || pp_Var2 != b) {
    if (__src != pp_Var1) {
      memmove(b,__src,(long)pp_Var1 - (long)__src);
      lVar3 = (this->super_QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>)
              .size;
    }
  }
  else {
    (this->super_QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>).ptr =
         __src;
  }
  (this->super_QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>).size =
       lVar3 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }